

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string *value)

{
  string *buffer;
  CodedInputStream *this;
  bool bVar1;
  int iVar2;
  LogMessage *other;
  pair<char_*,_bool> pVar3;
  bool local_c1;
  string *value_local;
  CodedInputStream *input_local;
  string *psStack_a8;
  uint32 length;
  CodedInputStream *local_a0;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  char *local_48;
  undefined1 local_40;
  char *local_38;
  pair<char_*,_bool> z;
  bool local_9;
  
  psStack_a8 = value;
  local_a0 = input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)((long)&input_local + 4));
  this = local_a0;
  buffer = psStack_a8;
  local_c1 = false;
  if (bVar1) {
    z._12_4_ = input_local._4_4_;
    if (input_local._4_4_ < 0) {
      local_9 = false;
    }
    else {
      iVar2 = io::CodedInputStream::BufferSize(local_a0);
      if (iVar2 < (int)z._12_4_) {
        local_9 = io::CodedInputStream::ReadStringFallback(this,buffer,z._12_4_);
      }
      else {
        STLStringResizeUninitialized(buffer,(long)(int)z._12_4_);
        pVar3 = io::as_string_data(buffer);
        local_48 = pVar3.first;
        local_40 = pVar3.second;
        if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_81 = 0;
          local_38 = local_48;
          z.first._0_1_ = local_40;
          if (local_48 == (char *)0x0) {
            LogMessage::LogMessage
                      (&local_80,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream_inl.h"
                       ,0x3c);
            local_81 = 1;
            other = LogMessage::operator<<(&local_80,"CHECK failed: z.first != NULL: ");
            LogFinisher::operator=(local_95,other);
          }
          if ((local_81 & 1) != 0) {
            LogMessage::~LogMessage(&local_80);
          }
          memcpy(local_38,this->buffer_,(long)(int)z._12_4_);
          io::CodedInputStream::Advance(this,z._12_4_);
        }
        local_9 = true;
      }
    }
    local_c1 = local_9;
  }
  return local_c1;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, string* value) {
  return ReadBytesToString(input, value);
}